

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynClassElements * ParseClassElements(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynFunctionDefinition> functions_00;
  IntrusiveList<SynAccessor> accessors_00;
  IntrusiveList<SynVariableDefinitions> members_00;
  IntrusiveList<SynConstantSet> constantSets_00;
  IntrusiveList<SynClassStaticIf> staticIfs_00;
  IntrusiveList<SynTypedef> typedefs_00;
  SynTypedef *node_00;
  SynClassStaticIf *node_01;
  SynFunctionDefinition *node_02;
  SynAccessor *node_03;
  SynVariableDefinitions *node_04;
  SynConstantSet *node_05;
  SynClassElements *this;
  Lexeme *local_128;
  Lexeme *end;
  SynConstantSet *node_5;
  SynVariableDefinitions *node_4;
  SynAccessor *node_3;
  SynFunctionDefinition *node_2;
  SynClassStaticIf *node_1;
  SynTypedef *node;
  IntrusiveList<SynClassStaticIf> staticIfs;
  IntrusiveList<SynConstantSet> constantSets;
  IntrusiveList<SynVariableDefinitions> members;
  IntrusiveList<SynAccessor> accessors;
  IntrusiveList<SynFunctionDefinition> functions;
  IntrusiveList<SynTypedef> typedefs;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  IntrusiveList<SynTypedef>::IntrusiveList((IntrusiveList<SynTypedef> *)&functions.tail);
  IntrusiveList<SynFunctionDefinition>::IntrusiveList
            ((IntrusiveList<SynFunctionDefinition> *)&accessors.tail);
  IntrusiveList<SynAccessor>::IntrusiveList((IntrusiveList<SynAccessor> *)&members.tail);
  IntrusiveList<SynVariableDefinitions>::IntrusiveList
            ((IntrusiveList<SynVariableDefinitions> *)&constantSets.tail);
  IntrusiveList<SynConstantSet>::IntrusiveList((IntrusiveList<SynConstantSet> *)&staticIfs.tail);
  IntrusiveList<SynClassStaticIf>::IntrusiveList((IntrusiveList<SynClassStaticIf> *)&node);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while (node_00 = ParseTypedef(ctx), node_00 != (SynTypedef *)0x0) {
              IntrusiveList<SynTypedef>::push_back
                        ((IntrusiveList<SynTypedef> *)&functions.tail,node_00);
            }
            node_01 = ParseClassStaticIf(ctx,false);
            if (node_01 == (SynClassStaticIf *)0x0) break;
            IntrusiveList<SynClassStaticIf>::push_back
                      ((IntrusiveList<SynClassStaticIf> *)&node,node_01);
          }
          node_02 = ParseFunctionDefinition(ctx);
          if (node_02 == (SynFunctionDefinition *)0x0) break;
          IntrusiveList<SynFunctionDefinition>::push_back
                    ((IntrusiveList<SynFunctionDefinition> *)&accessors.tail,node_02);
        }
        node_03 = ParseAccessorDefinition(ctx);
        if (node_03 == (SynAccessor *)0x0) break;
        IntrusiveList<SynAccessor>::push_back((IntrusiveList<SynAccessor> *)&members.tail,node_03);
      }
      node_04 = ParseVariableDefinitions(ctx,true);
      if (node_04 == (SynVariableDefinitions *)0x0) break;
      IntrusiveList<SynVariableDefinitions>::push_back
                ((IntrusiveList<SynVariableDefinitions> *)&constantSets.tail,node_04);
    }
    node_05 = ParseConstantSet(ctx);
    if (node_05 == (SynConstantSet *)0x0) break;
    IntrusiveList<SynConstantSet>::push_back
              ((IntrusiveList<SynConstantSet> *)&staticIfs.tail,node_05);
  }
  local_128 = begin;
  if (begin != ctx->currentLexeme) {
    local_128 = ParseContext::Previous(ctx);
  }
  this = ParseContext::get<SynClassElements>(ctx);
  typedefs_00.tail = typedefs.head;
  typedefs_00.head = (SynTypedef *)functions.tail;
  functions_00.tail = functions.head;
  functions_00.head = (SynFunctionDefinition *)accessors.tail;
  accessors_00.tail = accessors.head;
  accessors_00.head = (SynAccessor *)members.tail;
  members_00.tail = members.head;
  members_00.head = (SynVariableDefinitions *)constantSets.tail;
  constantSets_00.tail = constantSets.head;
  constantSets_00.head = (SynConstantSet *)staticIfs.tail;
  staticIfs_00.tail = staticIfs.head;
  staticIfs_00.head = (SynClassStaticIf *)node;
  SynClassElements::SynClassElements
            (this,begin,local_128,typedefs_00,functions_00,accessors_00,members_00,constantSets_00,
             staticIfs_00);
  return this;
}

Assistant:

SynClassElements* ParseClassElements(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	IntrusiveList<SynTypedef> typedefs;
	IntrusiveList<SynFunctionDefinition> functions;
	IntrusiveList<SynAccessor> accessors;
	IntrusiveList<SynVariableDefinitions> members;
	IntrusiveList<SynConstantSet> constantSets;
	IntrusiveList<SynClassStaticIf> staticIfs;

	for(;;)
	{
		if(SynTypedef *node = ParseTypedef(ctx))
		{
			typedefs.push_back(node);
		}
		else if(SynClassStaticIf *node = ParseClassStaticIf(ctx, false))
		{
			staticIfs.push_back(node);
		}
		else if(SynFunctionDefinition *node = ParseFunctionDefinition(ctx))
		{
			functions.push_back(node);
		}
		else if(SynAccessor *node = ParseAccessorDefinition(ctx))
		{
			accessors.push_back(node);
		}
		else if(SynVariableDefinitions *node = ParseVariableDefinitions(ctx, true))
		{
			members.push_back(node);
		}
		else if(SynConstantSet *node = ParseConstantSet(ctx))
		{
			constantSets.push_back(node);
		}
		else
		{
			break;
		}
	}

	Lexeme *end = start == ctx.currentLexeme ? start : ctx.Previous();

	return new (ctx.get<SynClassElements>()) SynClassElements(start, end, typedefs, functions, accessors, members, constantSets, staticIfs);
}